

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkingDirectory.cxx
# Opt level: O2

void __thiscall cmWorkingDirectory::cmWorkingDirectory(cmWorkingDirectory *this,string *newdir)

{
  string asStack_38 [32];
  
  (this->OldDir)._M_dataplus._M_p = (pointer)&(this->OldDir).field_2;
  (this->OldDir)._M_string_length = 0;
  (this->OldDir).field_2._M_local_buf[0] = '\0';
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  std::__cxx11::string::operator=((string *)this,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  SetDirectory(this,newdir);
  return;
}

Assistant:

cmWorkingDirectory::cmWorkingDirectory(std::string const& newdir)
{
  this->OldDir = cmSystemTools::GetCurrentWorkingDirectory();
  this->SetDirectory(newdir);
}